

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O1

vector<duckdb::Value,_true> *
duckdb::ToValueVector
          (vector<duckdb::Value,_true> *__return_storage_ptr__,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *string_vector)

{
  pointer pbVar1;
  pointer pcVar2;
  pointer pbVar3;
  string local_90;
  Value local_70;
  
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pbVar3 = (string_vector->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (string_vector->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 != pbVar1) {
    do {
      pcVar2 = (pbVar3->_M_dataplus)._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar2,pcVar2 + pbVar3->_M_string_length);
      Value::Value(&local_70,&local_90);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)__return_storage_ptr__,
                 &local_70);
      Value::~Value(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != pbVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<Value> ToValueVector(vector<string> &string_vector) {
	vector<Value> result;
	for (string &str : string_vector) {
		result.emplace_back(Value(str));
	}
	return result;
}